

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

void qpdf_cleanup(qpdf_data *qpdf)

{
  Pipeline *pPVar1;
  char *cstr;
  qpdf_data this;
  QPDFLogger local_30;
  bool local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<QPDFObjectHandle>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<QPDFObjectHandle>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<QPDFObjectHandle>_>_>_>
  ::clear(&((*qpdf)->oh_cache)._M_t);
  this = *qpdf;
  if ((this->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    QPDFLogger::defaultLogger();
    QPDFLogger::getWarn(&local_30,local_20);
    pPVar1 = Pipeline::operator<<
                       ((Pipeline *)
                        local_30.m.
                        super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        "WARNING: application did not handle error: ");
    cstr = (char *)(**(code **)(*(long *)((*qpdf)->error).
                                         super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_ptr + 0x10))();
    pPVar1 = Pipeline::operator<<(pPVar1,cstr);
    Pipeline::operator<<(pPVar1,"\n");
    if (local_30.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    this = *qpdf;
    if (this == (qpdf_data)0x0) {
      this = (_qpdf_data *)0x0;
      goto LAB_0024a936;
    }
  }
  _qpdf_data::~_qpdf_data(this);
LAB_0024a936:
  operator_delete(this,0x148);
  *qpdf = (qpdf_data)0x0;
  return;
}

Assistant:

void
qpdf_cleanup(qpdf_data* qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_cleanup");
    qpdf_oh_release_all(*qpdf);
    if ((*qpdf)->error.get()) {
        QTC::TC("qpdf", "qpdf-c cleanup warned about unhandled error");
        *QPDFLogger::defaultLogger()->getWarn()
            << "WARNING: application did not handle error: " << (*qpdf)->error->what() << "\n";
    }
    delete *qpdf;
    *qpdf = nullptr;
}